

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile.cpp
# Opt level: O0

void duckdb::QuantileScalarOperation<true,duckdb::QuantileStandardType>::
     Window<duckdb::QuantileState<int,duckdb::QuantileStandardType>,int,int>
               (AggregateInputData *aggr_input_data,WindowPartitionInput *partition,
               const_data_ptr_t g_state,data_ptr_t l_state,SubFrames *frames,Vector *result,
               idx_t ridx)

{
  bool bVar1;
  int iVar2;
  CursorType *dmask_p;
  idx_t iVar3;
  int *piVar4;
  TemplatedValidityMask<unsigned_long> *this;
  WindowQuantileState<int> *this_00;
  QuantileIncluded<int> *in_RDX;
  SubFrames *in_RSI;
  CursorType *in_RDI;
  WindowQuantileState<int> *unaff_retaddr;
  WindowQuantileState<int> *window_state;
  value_type *quantile;
  ValidityMask *rmask;
  int *rdata;
  QuantileBindData *bind_data;
  idx_t n;
  QuantileIncluded<int> included;
  ValidityMask *fmask;
  CursorType *data;
  QuantileState<int,_duckdb::QuantileStandardType> *gstate;
  QuantileState<int,_duckdb::QuantileStandardType> *state;
  vector<duckdb::FrameBounds,_true> *in_stack_ffffffffffffff68;
  QuantileState<int,_duckdb::QuantileStandardType> *in_stack_ffffffffffffff70;
  WindowPartitionInput *in_stack_ffffffffffffff78;
  QuantileState<int,_duckdb::QuantileStandardType> *in_stack_ffffffffffffff80;
  QuantileIncluded<int> local_60;
  pointer local_50;
  QuantileIncluded<int> *included_00;
  
  included_00 = in_RDX;
  dmask_p = QuantileState<int,_duckdb::QuantileStandardType>::GetOrCreateWindowCursor
                      (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  local_50 = in_RSI[3].super_vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>.
             super__Vector_base<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  QuantileIncluded<int>::QuantileIncluded(&local_60,(ValidityMask *)local_50,dmask_p);
  iVar3 = QuantileOperation::FrameSize<int>(in_RDX,(SubFrames *)dmask_p);
  optional_ptr<duckdb::FunctionData,_true>::operator->
            ((optional_ptr<duckdb::FunctionData,_true> *)in_stack_ffffffffffffff70);
  FunctionData::Cast<duckdb::QuantileBindData>((FunctionData *)in_stack_ffffffffffffff70);
  piVar4 = FlatVector::GetData<int>((Vector *)0xa100c1);
  this = &FlatVector::Validity((Vector *)0xa100d0)->super_TemplatedValidityMask<unsigned_long>;
  if (iVar3 == 0) {
    TemplatedValidityMask<unsigned_long>::Set
              (this,(idx_t)in_stack_ffffffffffffff78,
               SUB81((ulong)in_stack_ffffffffffffff70 >> 0x38,0));
  }
  else {
    vector<duckdb::QuantileValue,_true>::operator[]
              ((vector<duckdb::QuantileValue,_true> *)in_stack_ffffffffffffff70,
               (size_type)in_stack_ffffffffffffff68);
    if ((in_RDX == (QuantileIncluded<int> *)0x0) ||
       (bVar1 = QuantileState<int,_duckdb::QuantileStandardType>::HasTree(in_stack_ffffffffffffff70)
       , !bVar1)) {
      this_00 = QuantileState<int,_duckdb::QuantileStandardType>::GetOrCreateWindowState
                          (in_stack_ffffffffffffff70);
      WindowQuantileState<int>::UpdateSkip(unaff_retaddr,in_RDI,in_RSI,included_00);
      iVar2 = WindowQuantileState<int>::WindowScalar<int,true>
                        ((WindowQuantileState<int> *)l_state,(CursorType *)frames,
                         (SubFrames *)result,(idx_t)state,(Vector *)gstate,(QuantileValue *)data);
      piVar4[(long)window_state] = iVar2;
      vector<duckdb::FrameBounds,_true>::operator=
                ((vector<duckdb::FrameBounds,_true> *)this_00,in_stack_ffffffffffffff68);
    }
    else {
      QuantileState<int,_duckdb::QuantileStandardType>::GetWindowState
                ((QuantileState<int,_duckdb::QuantileStandardType> *)0xa1012f);
      iVar2 = WindowQuantileState<int>::WindowScalar<int,true>
                        ((WindowQuantileState<int> *)l_state,(CursorType *)frames,
                         (SubFrames *)result,(idx_t)state,(Vector *)gstate,(QuantileValue *)data);
      piVar4[(long)window_state] = iVar2;
    }
  }
  return;
}

Assistant:

static void Window(AggregateInputData &aggr_input_data, const WindowPartitionInput &partition,
	                   const_data_ptr_t g_state, data_ptr_t l_state, const SubFrames &frames, Vector &result,
	                   idx_t ridx) {
		auto &state = *reinterpret_cast<STATE *>(l_state);
		auto gstate = reinterpret_cast<const STATE *>(g_state);

		auto &data = state.GetOrCreateWindowCursor(partition);
		const auto &fmask = partition.filter_mask;

		QuantileIncluded<INPUT_TYPE> included(fmask, data);
		const auto n = FrameSize(included, frames);

		D_ASSERT(aggr_input_data.bind_data);
		auto &bind_data = aggr_input_data.bind_data->Cast<QuantileBindData>();

		auto rdata = FlatVector::GetData<RESULT_TYPE>(result);
		auto &rmask = FlatVector::Validity(result);

		if (!n) {
			rmask.Set(ridx, false);
			return;
		}

		const auto &quantile = bind_data.quantiles[0];
		if (gstate && gstate->HasTree()) {
			rdata[ridx] = gstate->GetWindowState().template WindowScalar<RESULT_TYPE, DISCRETE>(data, frames, n, result,
			                                                                                    quantile);
		} else {
			auto &window_state = state.GetOrCreateWindowState();

			//	Update the skip list
			window_state.UpdateSkip(data, frames, included);

			// Find the position(s) needed
			rdata[ridx] = window_state.template WindowScalar<RESULT_TYPE, DISCRETE>(data, frames, n, result, quantile);

			//	Save the previous state for next time
			window_state.prevs = frames;
		}
	}